

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

token * __thiscall
tinyusdz::AttrMetas::get_colorSpace(token *__return_storage_ptr__,AttrMetas *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  mapped_type *this_00;
  key_type local_40;
  
  bVar3 = has_colorSpace(this);
  if (bVar3) {
    paVar2 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"colorSpace","");
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::at(&this->meta,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)paVar2;
    bVar3 = MetaVariable::get_value<tinyusdz::Token>(this_00,(Token *)&local_40);
    paVar1 = &(__return_storage_ptr__->str_).field_2;
    (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)paVar1;
    if (bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->str_).field_2 + 8) = local_40.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->str_)._M_dataplus._M_p = local_40._M_dataplus._M_p;
        (__return_storage_ptr__->str_).field_2._M_allocated_capacity =
             CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->str_)._M_string_length = local_40._M_string_length;
    }
    else {
      (__return_storage_ptr__->str_)._M_string_length = 0;
      (__return_storage_ptr__->str_).field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar2) {
        operator_delete(local_40._M_dataplus._M_p,
                        CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                                 local_40.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  else {
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    (__return_storage_ptr__->str_)._M_string_length = 0;
    (__return_storage_ptr__->str_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

value::token AttrMetas::get_colorSpace() const {
  if (!has_colorSpace()) {
    return value::token();
  }

  const MetaVariable &mv = meta.at("colorSpace");
  value::token tok;
  if (mv.get_value<value::token>(&tok)) {
    return tok;
  }

  return value::token();
}